

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool __thiscall QCss::Parser::parseCombinator(Parser *this,Relation *relation)

{
  bool bVar1;
  TokenType TVar2;
  Parser *in_RSI;
  Parser *in_RDI;
  Parser *unaff_retaddr;
  Parser *this_00;
  
  *(undefined4 *)&(in_RSI->symbols).d.d = 0;
  this_00 = in_RDI;
  TVar2 = lookup(unaff_retaddr);
  if (TVar2 == S) {
    *(undefined4 *)&(in_RSI->symbols).d.d = 1;
    skipSpace(in_RSI);
  }
  else {
    prev(in_RDI);
  }
  bVar1 = test(this_00,(TokenType)((ulong)in_RSI >> 0x20));
  if (bVar1) {
    *(undefined4 *)&(in_RSI->symbols).d.d = 3;
  }
  else {
    bVar1 = test(this_00,(TokenType)((ulong)in_RSI >> 0x20));
    if (bVar1) {
      *(undefined4 *)&(in_RSI->symbols).d.d = 2;
    }
    else {
      bVar1 = test(this_00,(TokenType)((ulong)in_RSI >> 0x20));
      if (bVar1) {
        *(undefined4 *)&(in_RSI->symbols).d.d = 4;
      }
    }
  }
  skipSpace(in_RSI);
  return true;
}

Assistant:

bool Parser::parseCombinator(BasicSelector::Relation *relation)
{
    *relation = BasicSelector::NoRelation;
    if (lookup() == S) {
        *relation = BasicSelector::MatchNextSelectorIfAncestor;
        skipSpace();
    } else {
        prev();
    }
    if (test(PLUS)) {
        *relation = BasicSelector::MatchNextSelectorIfDirectAdjecent;
    } else if (test(GREATER)) {
        *relation = BasicSelector::MatchNextSelectorIfParent;
    } else if (test(TILDE)) {
        *relation = BasicSelector::MatchNextSelectorIfIndirectAdjecent;
    }
    skipSpace();
    return true;
}